

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O1

uint32_t __thiscall tinyusdz::value::TimeSamples::type_id(TimeSamples *this)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  
  if ((this->_samples).
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_samples).
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar2 = 0;
  }
  else {
    if (this->_dirty == true) {
      update(this);
    }
    pvVar1 = (((this->_samples).
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start)->value).v_.vtable;
    if (pvVar1 != (vtable_type *)0x0) {
      uVar2 = (*pvVar1->type_id)();
      return uVar2;
    }
    uVar2 = 2;
  }
  return uVar2;
}

Assistant:

inline void set_scale(double sx, double sy) {
    m[0][0] = sx;
    m[0][1] = 0.0;

    m[1][0] = 0.0;
    m[1][1] = sy;
  }